

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::StructNew*,unsigned_long>
          (ValidationInfo *this,unsigned_long left,unsigned_long right,StructNew *curr,char *text,
          Function *func)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream local_1b8 [8];
  ostringstream ss;
  Function *func_local;
  char *text_local;
  StructNew *curr_local;
  unsigned_long right_local;
  unsigned_long left_local;
  ValidationInfo *this_local;
  
  if (left != right) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar1 = (ostream *)std::ostream::operator<<(local_1b8,left);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,right);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::ostringstream::str();
    fail<wasm::StructNew*,std::__cxx11::string>(this,&local_1e8,curr,func);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  return left == right;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }